

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O2

Entry * __thiscall de::cmdline::detail::TypedFieldMap::get(TypedFieldMap *this,type_info *key)

{
  const_iterator cVar1;
  out_of_range *this_00;
  type_info *key_local;
  
  key_local = key;
  cVar1 = std::
          _Rb_tree<const_std::type_info_*,_std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>,_std::_Select1st<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
          ::find((_Rb_tree<const_std::type_info_*,_std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>,_std::_Select1st<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
                  *)this,&key_local);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_fields)._M_t._M_impl.super__Rb_tree_header) {
    return (Entry *)&cVar1._M_node[1]._M_parent;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Value not set");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

const TypedFieldMap::Entry& TypedFieldMap::get (const std::type_info* key) const
{
	Map::const_iterator pos = m_fields.find(key);
	if (pos != m_fields.end())
		return pos->second;
	else
		throw std::out_of_range("Value not set");
}